

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BinsSelectConditionExprSyntax *pBVar1;
  Token TVar2;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  IntersectClauseSyntax *in_stack_ffffffffffffffa0;
  Info *args_4;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = TVar2.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x27b990);
  deepClone<slang::syntax::NameSyntax>
            ((NameSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  if ((((NameSyntax *)((long)__fn + 0x48))->super_ExpressionSyntax).super_SyntaxNode.parent !=
      (SyntaxNode *)0x0) {
    deepClone<slang::syntax::IntersectClauseSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinsSelectConditionExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::IntersectClauseSyntax*>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(NameSyntax *)__fn,
                      (Token *)__child_stack,(IntersectClauseSyntax **)args_4);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinsSelectConditionExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinsSelectConditionExprSyntax>(
        node.binsof.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.closeParen.deepClone(alloc),
        node.intersects ? deepClone(*node.intersects, alloc) : nullptr
    );
}